

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::OP_GetThisNoFastPath
              (Var thisVar,int moduleID,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  Var pvVar5;
  HostObjectBase *pHVar6;
  char *message;
  char *error;
  RootObjectBase *rootObject;
  uint lineNumber;
  Type typeId;
  
  if (thisVar == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00ab2a97;
    *puVar4 = 0;
LAB_00ab2885:
    this = UnsafeVarTo<Js::RecyclableObject>(thisVar);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00ab2a97;
      *puVar4 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((int)typeId < 0x58) {
      if (typeId - TypeIds_HostDispatch < 0x3b) {
        if (typeId == TypeIds_LastTrueJavascriptObjectType) {
          pHVar6 = RootObjectBase::GetHostObject((RootObjectBase *)thisVar);
          if (pHVar6 == (HostObjectBase *)0x0) {
            return thisVar;
          }
          pvVar5 = (Var)(**(code **)(*(long *)pHVar6 + 0x2b8))(pHVar6);
          if (pvVar5 == thisVar) {
            return thisVar;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          error = 
          "(typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar)"
          ;
          message = 
          "typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar"
          ;
          lineNumber = 0x156c;
        }
        else {
          if (typeId != TypeIds_GlobalObject) {
            return thisVar;
          }
          pvVar5 = GlobalObject::ToThis((GlobalObject *)thisVar);
          if (pvVar5 == thisVar) {
            return thisVar;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar4 = 1;
          error = 
          "(typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar)";
          message = 
          "typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar";
          lineNumber = 0x156b;
        }
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,lineNumber,error,message);
        if (bVar2) {
          *puVar4 = 0;
          return thisVar;
        }
LAB_00ab2a97:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      goto LAB_00ab29f7;
    }
    BVar3 = RecyclableObject::IsExternal(this);
    if (BVar3 != 0) goto LAB_00ab29f7;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar2) goto LAB_00ab2a97;
  }
  else {
    if (((ulong)thisVar & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)thisVar & 0xffff000000000000) != 0x1000000000000) {
      typeId = TypeIds_FirstNumberType;
      if ((((ulong)thisVar & 0xffff000000000000) == 0x1000000000000) ||
         (typeId = TypeIds_Number, (ulong)thisVar >> 0x32 != 0)) goto LAB_00ab29f7;
      goto LAB_00ab2885;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00ab2a97;
    typeId = TypeIds_FirstNumberType;
  }
  *puVar4 = 0;
LAB_00ab29f7:
  pvVar5 = GetThisHelper(thisVar,typeId,moduleID,&scriptContext->super_ScriptContextInfo);
  return pvVar5;
}

Assistant:

Var JavascriptOperators::OP_GetThisNoFastPath(Var thisVar, int moduleID, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(LdThisNoFastPath);
        TypeId typeId = JavascriptOperators::GetTypeId(thisVar);

        if (JavascriptOperators::IsThisSelf(typeId))
        {
            Assert(typeId != TypeIds_GlobalObject || ((Js::GlobalObject*)thisVar)->ToThis() == thisVar);
            Assert(typeId != TypeIds_ModuleRoot || JavascriptOperators::GetThisFromModuleRoot(thisVar) == thisVar);

            return thisVar;
        }

        return JavascriptOperators::GetThisHelper(thisVar, typeId, moduleID, scriptContext);
        JIT_HELPER_END(LdThisNoFastPath);
    }